

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

TestCaseProperties __thiscall
Catch::anon_unknown_26::parseSpecialTag(anon_unknown_26 *this,StringRef tag)

{
  char cVar1;
  bool bVar2;
  TestCaseProperties TVar3;
  StringRef other;
  StringRef other_00;
  StringRef other_01;
  StringRef other_02;
  StringRef other_03;
  StringRef tag_local;
  
  tag_local.m_size = (size_type)tag.m_start;
  tag_local.m_start = (char *)this;
  if (((char *)tag_local.m_size != (char *)0x0) &&
     (cVar1 = StringRef::operator[](&tag_local,0), cVar1 == '.')) {
    return IsHidden;
  }
  other.m_size = 7;
  other.m_start = "!throws";
  bVar2 = StringRef::operator==(&tag_local,other);
  TVar3 = Throws;
  if (!bVar2) {
    other_00.m_size = 0xb;
    other_00.m_start = "!shouldfail";
    bVar2 = StringRef::operator==(&tag_local,other_00);
    TVar3 = ShouldFail;
    if (!bVar2) {
      other_01.m_size = 8;
      other_01.m_start = "!mayfail";
      bVar2 = StringRef::operator==(&tag_local,other_01);
      TVar3 = MayFail;
      if (!bVar2) {
        other_02.m_size = 0xc;
        other_02.m_start = "!nonportable";
        bVar2 = StringRef::operator==(&tag_local,other_02);
        TVar3 = NonPortable;
        if (!bVar2) {
          other_03.m_size = 10;
          other_03.m_start = "!benchmark";
          bVar2 = StringRef::operator==(&tag_local,other_03);
          TVar3 = Benchmark|IsHidden;
          if (!bVar2) {
            TVar3 = None;
          }
        }
      }
    }
  }
  return TVar3;
}

Assistant:

TestCaseProperties parseSpecialTag( StringRef tag ) {
            if( !tag.empty() && tag[0] == '.' )
                return TestCaseProperties::IsHidden;
            else if( tag == "!throws"_sr )
                return TestCaseProperties::Throws;
            else if( tag == "!shouldfail"_sr )
                return TestCaseProperties::ShouldFail;
            else if( tag == "!mayfail"_sr )
                return TestCaseProperties::MayFail;
            else if( tag == "!nonportable"_sr )
                return TestCaseProperties::NonPortable;
            else if( tag == "!benchmark"_sr )
                return TestCaseProperties::Benchmark | TestCaseProperties::IsHidden;
            else
                return TestCaseProperties::None;
        }